

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

int __thiscall
TPZBlockDiagonal<std::complex<float>_>::ClassId(TPZBlockDiagonal<std::complex<float>_> *this)

{
  uint uVar1;
  int iVar2;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TPZBlockDiagonal","");
  uVar1 = Hash(&local_40);
  iVar2 = TPZMatrix<std::complex<float>_>::ClassId(&this->super_TPZMatrix<std::complex<float>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZBlockDiagonal<TVar>::ClassId() const{
    return Hash("TPZBlockDiagonal") ^ TPZMatrix<TVar>::ClassId() << 1;
}